

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Architecture.cpp
# Opt level: O3

void __thiscall
ArchitectureCommand::ArchitectureCommand(ArchitectureCommand *this,string *tempText,string *symText)

{
  pointer pcVar1;
  Architecture *pAVar2;
  Endianness EVar3;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__ArchitectureCommand_001bcf80;
  this->architecture = (Architecture *)0x0;
  (this->tempText)._M_dataplus._M_p = (pointer)&(this->tempText).field_2;
  pcVar1 = (tempText->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->tempText,pcVar1,pcVar1 + tempText->_M_string_length);
  (this->symText)._M_dataplus._M_p = (pointer)&(this->symText).field_2;
  pcVar1 = (symText->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->symText,pcVar1,pcVar1 + symText->_M_string_length);
  pAVar2 = Architecture::currentArchitecture;
  if (Architecture::currentArchitecture != (Architecture *)0x0) {
    this->architecture = Architecture::currentArchitecture;
    EVar3 = (*pAVar2->_vptr_Architecture[7])();
    this->endianness = EVar3;
    return;
  }
  __assert_fail("currentArchitecture",
                "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Archs/Architecture.cpp"
                ,0x10,"static Architecture &Architecture::current()");
}

Assistant:

ArchitectureCommand::ArchitectureCommand(const std::string& tempText, const std::string& symText)
	: tempText(tempText), symText(symText)
{
	this->architecture = &Architecture::current();
	this->endianness = Architecture::current().getEndianness();
}